

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

void __thiscall
wallet::OutputGroupTypeMap::Push
          (OutputGroupTypeMap *this,OutputGroup *group,OutputType type,bool insert_positive,
          bool insert_mixed)

{
  mapped_type *this_00;
  long in_FS_OFFSET;
  OutputType local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = type;
  if ((group->m_outputs).
      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (group->m_outputs).
      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = std::
              map<OutputType,_wallet::Groups,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
              ::operator[](&this->groups_by_type,&local_34);
    if ((insert_positive) &&
       (0 < *(long *)((long)&group->m_value + (ulong)((group->m_subtract_fee_outputs ^ 1) << 5)))) {
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>
                ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)this_00,group);
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>
                ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)
                 &this->all_groups,group);
    }
    if (insert_mixed) {
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>
                ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)
                 &this_00->mixed_group,group);
      std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
      emplace_back<wallet::OutputGroup_const&>
                ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)
                 &(this->all_groups).mixed_group,group);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void OutputGroupTypeMap::Push(const OutputGroup& group, OutputType type, bool insert_positive, bool insert_mixed)
{
    if (group.m_outputs.empty()) return;

    Groups& groups = groups_by_type[type];
    if (insert_positive && group.GetSelectionAmount() > 0) {
        groups.positive_group.emplace_back(group);
        all_groups.positive_group.emplace_back(group);
    }
    if (insert_mixed) {
        groups.mixed_group.emplace_back(group);
        all_groups.mixed_group.emplace_back(group);
    }
}